

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

any __thiscall
cs_impl::cni_helper<cs_impl::any_(*)(const_cs_impl::any_&),_cs_impl::any_(*)(const_cs_impl::any_&)>
::_call<0>(cni_helper<cs_impl::any_(*)(const_cs_impl::any_&),_cs_impl::any_(*)(const_cs_impl::any_&)>
           *this,vector *args,sequence<0> *param_2)

{
  void *in_RAX;
  undefined8 local_18;
  
  local_18 = in_RAX;
  std::function<cs_impl::any_(const_cs_impl::any_&)>::operator()
            ((function<cs_impl::any_(const_cs_impl::any_&)> *)&stack0xffffffffffffffe8,(any *)args);
  *(undefined8 *)&(this->mFunc).super__Function_base._M_functor = local_18;
  local_18 = (void *)0x0;
  any::recycle((any *)&stack0xffffffffffffffe8);
  return (any)(proxy *)this;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}